

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

value_type * __thiscall
nonstd::optional_lite::optional<tinyusdz::GeomCamera::StereoRole>::value
          (optional<tinyusdz::GeomCamera::StereoRole> *this)

{
  bool bVar1;
  value_type *pvVar2;
  optional<tinyusdz::GeomCamera::StereoRole> *this_local;
  
  bVar1 = has_value(this);
  if (!bVar1) {
    __assert_fail("has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                  ,0x584,
                  "const value_type &nonstd::optional_lite::optional<tinyusdz::GeomCamera::StereoRole>::value() const [T = tinyusdz::GeomCamera::StereoRole]"
                 );
  }
  pvVar2 = detail::storage_t<tinyusdz::GeomCamera::StereoRole>::value
                     ((storage_t<tinyusdz::GeomCamera::StereoRole> *)&this->contained);
  return pvVar2;
}

Assistant:

optional_constexpr14 value_type const & value() const optional_ref_qual
    {
#if optional_CONFIG_NO_EXCEPTIONS
        assert( has_value() );
#else
        if ( ! has_value() )
        {
            throw bad_optional_access();
        }
#endif
        return contained.value();
    }